

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

bool leveldb::ParseFileName(string *filename,uint64_t *number,FileType *type)

{
  bool bVar1;
  FileType FVar2;
  uint64_t num;
  size_t sStack_50;
  Slice rest;
  uint64_t num_1;
  Slice local_30;
  Slice local_20;
  
  rest.data_ = (filename->_M_dataplus)._M_p;
  rest.size_ = filename->_M_string_length;
  num = (long)"/CURRENT" + 1;
  sStack_50 = 7;
  bVar1 = operator==(&rest,(Slice *)&num);
  if (bVar1) {
    *number = 0;
    *type = kCurrentFile;
    return true;
  }
  num = (long)"/LOCK" + 1;
  sStack_50 = 4;
  bVar1 = operator==(&rest,(Slice *)&num);
  if (bVar1) {
    *number = 0;
    *type = kDBLockFile;
    return true;
  }
  num = (long)"/LOG" + 1;
  sStack_50 = 3;
  bVar1 = operator==(&rest,(Slice *)&num);
  if (bVar1) {
LAB_00105a54:
    *number = 0;
    *type = kInfoLogFile;
    return true;
  }
  local_30.data_ = "LOG.old";
  local_30.size_ = 7;
  bVar1 = operator==(&rest,&local_30);
  if (bVar1) goto LAB_00105a54;
  num = (uint64_t)anon_var_dwarf_ec1c;
  sStack_50 = 9;
  bVar1 = Slice::starts_with(&rest,(Slice *)&num);
  if (bVar1) {
    rest.data_ = rest.data_ + 9;
    rest.size_ = rest.size_ - 9;
    bVar1 = ConsumeDecimalNumber(&rest,&num);
    if ((!bVar1) || (rest.size_ != 0)) {
      return false;
    }
    *type = kDescriptorFile;
    goto LAB_00105b56;
  }
  bVar1 = ConsumeDecimalNumber(&rest,&num_1);
  if (!bVar1) {
    return false;
  }
  num = (uint64_t)rest.data_;
  sStack_50 = rest.size_;
  local_30.data_ = ".log";
  local_30.size_ = 4;
  bVar1 = operator==((Slice *)&num,&local_30);
  FVar2 = kLogFile;
  if (!bVar1) {
    local_30.data_ = ".sst";
    local_30.size_ = 4;
    bVar1 = operator==((Slice *)&num,&local_30);
    if (!bVar1) {
      local_20.data_ = ".ldb";
      local_20.size_ = 4;
      bVar1 = operator==((Slice *)&num,&local_20);
      if (!bVar1) {
        local_30.data_ = ".dbtmp";
        local_30.size_ = 6;
        bVar1 = operator==((Slice *)&num,&local_30);
        if (!bVar1) {
          return false;
        }
        FVar2 = kTempFile;
        goto LAB_00105b4e;
      }
    }
    FVar2 = kTableFile;
  }
LAB_00105b4e:
  *type = FVar2;
  num = num_1;
LAB_00105b56:
  *number = num;
  return true;
}

Assistant:

bool ParseFileName(const std::string& filename, uint64_t* number,
                   FileType* type) {
  Slice rest(filename);
  if (rest == "CURRENT") {
    *number = 0;
    *type = kCurrentFile;
  } else if (rest == "LOCK") {
    *number = 0;
    *type = kDBLockFile;
  } else if (rest == "LOG" || rest == "LOG.old") {
    *number = 0;
    *type = kInfoLogFile;
  } else if (rest.starts_with("MANIFEST-")) {
    rest.remove_prefix(strlen("MANIFEST-"));
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    if (!rest.empty()) {
      return false;
    }
    *type = kDescriptorFile;
    *number = num;
  } else {
    // Avoid strtoull() to keep filename format independent of the
    // current locale
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    Slice suffix = rest;
    if (suffix == Slice(".log")) {
      *type = kLogFile;
    } else if (suffix == Slice(".sst") || suffix == Slice(".ldb")) {
      *type = kTableFile;
    } else if (suffix == Slice(".dbtmp")) {
      *type = kTempFile;
    } else {
      return false;
    }
    *number = num;
  }
  return true;
}